

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  path *this;
  ostream *poVar1;
  directory_iterator local_f8;
  directory_iterator __end1;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_d0;
  path local_c0;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_80;
  string dir;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dir,"/",(allocator<char> *)&local_c0);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_c0,&dir,auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&local_d0,&local_c0);
  std::filesystem::__cxx11::path::~path(&local_c0);
  std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_98,&local_d0);
  local_f8._M_dir._M_ptr = local_98._M_ptr;
  local_f8._M_dir._M_refcount._M_pi = local_98._M_refcount._M_pi;
  local_98._M_ptr = (element_type *)0x0;
  local_98._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
  std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_80,&local_d0);
  __end1._M_dir._M_ptr = (element_type *)0x0;
  __end1._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  while (local_f8._M_dir._M_refcount._M_pi != __end1._M_dir._M_refcount._M_pi) {
    this = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_f8);
    poVar1 = std::operator<<((ostream *)&std::cout,"name: ");
    std::filesystem::__cxx11::path::filename(&local_c0,this);
    std::filesystem::__cxx11::path::string(&local_50,&local_c0);
    poVar1 = std::operator<<(poVar1,(string *)&local_50);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string((string *)&local_50);
    std::filesystem::__cxx11::path::~path(&local_c0);
    std::filesystem::__cxx11::directory_iterator::operator++(&local_f8);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&__end1._M_dir._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8._M_dir._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
  std::__cxx11::string::~string((string *)&dir);
  return 0;
}

Assistant:

int main() {
    std::string dir = "/";

    try {
        for (const auto& entry : std::filesystem::directory_iterator(dir)) {
            std::cout << "name: " << entry.path().filename().string() << "\n";
        }
    } catch (std::filesystem::filesystem_error& e) {
        std::cout << "An error has occurred: " << e.what() << '\n';
    }

    return 0;
}